

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void process_file(path *file,vector<IncludePath,_std::allocator<IncludePath>_> *include_paths,
                 map<IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::less<IncludePath>,_std::allocator<std::pair<const_IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>_>_>
                 *headers,ProcessResult *result)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  istream *piVar4;
  reference pvVar5;
  size_type sVar6;
  basic_ostream<char,_std::char_traits<char>_> *pbVar7;
  string local_908 [32];
  string local_8e8;
  ostream local_8c8 [8];
  ofstream out;
  Candidate *alt;
  int alt_idx;
  undefined1 local_6b0 [7];
  bool changed_include_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  byte local_629;
  string local_628 [7];
  bool emit_system_include;
  string fixed_path_with_quotes;
  Candidate fix;
  vector<Candidate,_std::allocator<Candidate>_> candidate_fixes;
  IncludeStmt current;
  string local_550 [32];
  string local_530 [39];
  byte local_509;
  undefined8 uStack_508;
  bool system;
  size_t endPathPos;
  string path_with_quotes;
  string behind_path;
  string path;
  undefined1 local_498 [8];
  string prefix_user;
  undefined1 local_470 [8];
  string prefix_system;
  string local_448 [8];
  string prefix_all;
  string line;
  istream local_3e8 [8];
  ifstream in;
  stringstream local_1e0 [8];
  stringstream buffer;
  ostream local_1d0 [392];
  string local_48;
  ProcessResult *local_28;
  ProcessResult *result_local;
  map<IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::less<IncludePath>,_std::allocator<std::pair<const_IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>_>_>
  *headers_local;
  vector<IncludePath,_std::allocator<IncludePath>_> *include_paths_local;
  path *file_local;
  
  local_28 = result;
  result_local = (ProcessResult *)headers;
  headers_local =
       (map<IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::less<IncludePath>,_std::allocator<std::pair<const_IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>_>_>
        *)include_paths;
  include_paths_local = (vector<IncludePath,_std::allocator<IncludePath>_> *)file;
  poVar3 = std::operator<<((ostream *)&std::cout,"    Process ");
  std::filesystem::__cxx11::path::string(&local_48,file);
  poVar3 = std::operator<<(poVar3,(string *)&local_48);
  poVar3 = std::operator<<(poVar3," ...");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::stringstream::stringstream(local_1e0);
  std::filesystem::__cxx11::path::string((string *)((long)&line.field_2 + 8),file);
  std::ifstream::ifstream(local_3e8,(undefined1 *)((long)&line.field_2 + 8),8);
  std::__cxx11::string::~string((string *)(line.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(prefix_all.field_2._M_local_buf + 8));
  do {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (local_3e8,(string *)(prefix_all.field_2._M_local_buf + 8),'\n');
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!bVar1) {
      std::ifstream::close();
      if ((dry_run & 1U) == 0) {
        std::filesystem::__cxx11::path::string(&local_8e8,file);
        std::ofstream::ofstream(local_8c8,&local_8e8,0x10);
        std::__cxx11::string::~string((string *)&local_8e8);
        std::__cxx11::stringstream::str();
        std::operator<<(local_8c8,local_908);
        std::__cxx11::string::~string(local_908);
        std::ofstream::close();
        std::ofstream::~ofstream(local_8c8);
      }
      std::__cxx11::string::~string((string *)(prefix_all.field_2._M_local_buf + 8));
      std::ifstream::~ifstream(local_3e8);
      std::__cxx11::stringstream::~stringstream(local_1e0);
      return;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_448,"#include ",(allocator<char> *)(prefix_system.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(prefix_system.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_470,"#include <",
               (allocator<char> *)(prefix_user.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(prefix_user.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_498,"#include \"",
               (allocator<char> *)(path.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(path.field_2._M_local_buf + 0xf));
    bVar1 = boost::algorithm::starts_with<std::__cxx11::string,std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&prefix_all.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_498);
    if ((bVar1) ||
       ((bVar1 = boost::algorithm::starts_with<std::__cxx11::string,std::__cxx11::string>
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&prefix_all.field_2 + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_470), bVar1 && ((process_system_includes & 1U) != 0)))) {
      local_28->total = local_28->total + 1;
      std::__cxx11::string::string((string *)(behind_path.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(path_with_quotes.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)&endPathPos);
      uStack_508 = 0;
      local_509 = 0;
      bVar1 = boost::algorithm::starts_with<std::__cxx11::string,std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&prefix_all.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_498);
      if (bVar1) {
        std::__cxx11::string::size();
        uStack_508 = std::__cxx11::string::find(prefix_all.field_2._M_local_buf + 8,0x12396d);
        local_509 = 0;
      }
      else {
        bVar1 = boost::algorithm::starts_with<std::__cxx11::string,std::__cxx11::string>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&prefix_all.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_470);
        if (bVar1) {
          std::__cxx11::string::size();
          uStack_508 = std::__cxx11::string::find(prefix_all.field_2._M_local_buf + 8,0x12396f);
          local_509 = 1;
        }
      }
      std::__cxx11::string::size();
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_530,(ulong)((long)&prefix_all.field_2 + 8));
      std::__cxx11::string::operator=((string *)(behind_path.field_2._M_local_buf + 8),local_530);
      std::__cxx11::string::~string(local_530);
      std::__cxx11::string::size();
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_550,(ulong)((long)&prefix_all.field_2 + 8));
      std::__cxx11::string::operator=((string *)&endPathPos,local_550);
      std::__cxx11::string::~string(local_550);
      std::__cxx11::string::substr((ulong)&current.system,(ulong)((long)&prefix_all.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)(path_with_quotes.field_2._M_local_buf + 8),(string *)&current.system);
      std::__cxx11::string::~string((string *)&current.system);
      std::__cxx11::string::string
                ((string *)
                 &candidate_fixes.super__Vector_base<Candidate,_std::allocator<Candidate>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (string *)(behind_path.field_2._M_local_buf + 8));
      current.path.field_2._M_local_buf[8] = local_509 & 1;
      fix_include((vector<Candidate,_std::allocator<Candidate>_> *)&fix.filename_distance,
                  (IncludeStmt *)
                  &candidate_fixes.super__Vector_base<Candidate,_std::allocator<Candidate>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage,file,
                  (vector<IncludePath,_std::allocator<IncludePath>_> *)headers_local,
                  (map<IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::less<IncludePath>,_std::allocator<std::pair<const_IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>_>_>
                   *)result_local,(bool)(prefer_relative_to_root & 1));
      bVar1 = std::vector<Candidate,_std::allocator<Candidate>_>::empty
                        ((vector<Candidate,_std::allocator<Candidate>_> *)&fix.filename_distance);
      if (bVar1) {
        poVar3 = std::operator<<(local_1d0,(string *)(prefix_all.field_2._M_local_buf + 8));
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        local_28->failed = local_28->failed + 1;
        if (((omit_system_failed & 1U) == 0) || ((local_509 & 1) == 0)) {
          poVar3 = std::operator<<((ostream *)&std::cout,(string *)&RED_abi_cxx11_);
          poVar3 = std::operator<<(poVar3,anon_var_dwarf_13566);
          poVar3 = std::operator<<(poVar3,(string *)&endPathPos);
          poVar3 = std::operator<<(poVar3,(string *)&CLEAR_abi_cxx11_);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
      }
      else {
        pvVar5 = std::vector<Candidate,_std::allocator<Candidate>_>::operator[]
                           ((vector<Candidate,_std::allocator<Candidate>_> *)&fix.filename_distance,
                            0);
        Candidate::Candidate((Candidate *)((long)&fixed_path_with_quotes.field_2 + 8),pvVar5);
        std::__cxx11::string::string(local_628);
        local_629 = 0;
        if (((((local_509 & 1) != 0) &&
             (((byte)fix.search_path.path._M_cmpts._M_impl._M_t.
                     super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                     _M_head_impl & 1) != 0)) ||
            (((local_509 & 1) == 0 &&
             ((((byte)fix.search_path.path._M_cmpts._M_impl._M_t.
                      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                      _M_head_impl & 1) != 0 && ((user_to_system & 1U) != 0)))))) ||
           (((local_509 & 1) != 0 &&
            ((((byte)fix.search_path.path._M_cmpts._M_impl._M_t.
                     super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                     _M_head_impl & 1) == 0 && ((user_to_system & 1U) == 0)))))) {
          local_629 = 1;
        }
        if (local_629 == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_6b0,"\"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &fix.search_path.system);
          std::operator+(&local_690,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_6b0,"\"");
          std::__cxx11::string::operator=(local_628,(string *)&local_690);
          std::__cxx11::string::~string((string *)&local_690);
          std::__cxx11::string::~string((string *)local_6b0);
        }
        else {
          std::operator+(&local_670,"<",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &fix.search_path.system);
          std::operator+(&local_650,&local_670,">");
          std::__cxx11::string::operator=(local_628,(string *)&local_650);
          std::__cxx11::string::~string((string *)&local_650);
          std::__cxx11::string::~string((string *)&local_670);
        }
        bVar1 = (local_509 & 1) != (local_629 & 1);
        if (bVar1) {
          if ((local_509 & 1) == 0) {
            local_28->user_to_system = local_28->user_to_system + 1;
          }
          else {
            local_28->system_to_user = local_28->system_to_user + 1;
          }
        }
        poVar3 = std::operator<<(local_1d0,"#include ");
        poVar3 = std::operator<<(poVar3,local_628);
        poVar3 = std::operator<<(poVar3,(string *)(path_with_quotes.field_2._M_local_buf + 8));
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&fix.search_path.system,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&behind_path.field_2 + 8));
        if (bVar2) {
          local_28->replaced_path = local_28->replaced_path + 1;
          poVar3 = std::operator<<((ostream *)&std::cout,(string *)&YELLOW_abi_cxx11_);
          poVar3 = std::operator<<(poVar3,anon_var_dwarf_134e8);
          std::operator<<(poVar3,(string *)&endPathPos);
          poVar3 = std::operator<<((ostream *)&std::cout,"  ->  ");
          std::operator<<(poVar3,local_628);
          poVar3 = std::operator<<((ostream *)&std::cout,(string *)&DIM_abi_cxx11_);
          poVar3 = std::operator<<(poVar3,"  (distance: fn=");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,fix.header.field_2._8_4_);
          poVar3 = std::operator<<(poVar3,"; dir=");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,fix.header.field_2._12_4_);
          poVar3 = std::operator<<(poVar3,") from ");
          pbVar7 = std::filesystem::__cxx11::operator<<
                             ((basic_ostream<char,_std::char_traits<char>_> *)poVar3,
                              (path *)((long)&fixed_path_with_quotes.field_2 + 8));
          poVar3 = std::operator<<((ostream *)pbVar7,(string *)&CLEAR_abi_cxx11_);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
LAB_0010bbf9:
          for (alt._4_4_ = 1;
              sVar6 = std::vector<Candidate,_std::allocator<Candidate>_>::size
                                ((vector<Candidate,_std::allocator<Candidate>_> *)
                                 &fix.filename_distance), (ulong)(long)alt._4_4_ < sVar6;
              alt._4_4_ = alt._4_4_ + 1) {
            pvVar5 = std::vector<Candidate,_std::allocator<Candidate>_>::operator[]
                               ((vector<Candidate,_std::allocator<Candidate>_> *)
                                &fix.filename_distance,(long)alt._4_4_);
            poVar3 = std::operator<<((ostream *)&std::cout,(string *)&DIM_abi_cxx11_);
            poVar3 = std::operator<<(poVar3,"           - Alternative: ");
            std::operator<<(poVar3,(string *)&pvVar5->header);
            poVar3 = std::operator<<((ostream *)&std::cout,(string *)&DIM_abi_cxx11_);
            poVar3 = std::operator<<(poVar3,"  (distance: fn=");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar5->filename_distance);
            poVar3 = std::operator<<(poVar3,"; dir=");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar5->folder_distance);
            poVar3 = std::operator<<(poVar3,") from ");
            pbVar7 = std::filesystem::__cxx11::operator<<
                               ((basic_ostream<char,_std::char_traits<char>_> *)poVar3,
                                (path *)pvVar5);
            poVar3 = std::operator<<((ostream *)pbVar7,(string *)&CLEAR_abi_cxx11_);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          }
        }
        else {
          if (bVar1) {
            poVar3 = std::operator<<((ostream *)&std::cout,(string *)&BLUE_abi_cxx11_);
            poVar3 = std::operator<<(poVar3,anon_var_dwarf_13518);
            std::operator<<(poVar3,(string *)&endPathPos);
            poVar3 = std::operator<<((ostream *)&std::cout,"  ->  ");
            poVar3 = std::operator<<(poVar3,local_628);
            poVar3 = std::operator<<(poVar3,(string *)&CLEAR_abi_cxx11_);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            goto LAB_0010bbf9;
          }
          local_28->untouched = local_28->untouched + 1;
          if ((omit_untouched & 1U) == 0) {
            poVar3 = std::operator<<((ostream *)&std::cout,(string *)&GREEN_abi_cxx11_);
            poVar3 = std::operator<<(poVar3,anon_var_dwarf_13532);
            poVar3 = std::operator<<(poVar3,(string *)&endPathPos);
            poVar3 = std::operator<<(poVar3,(string *)&CLEAR_abi_cxx11_);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            goto LAB_0010bbf9;
          }
        }
        std::__cxx11::string::~string(local_628);
        Candidate::~Candidate((Candidate *)((long)&fixed_path_with_quotes.field_2 + 8));
      }
      std::vector<Candidate,_std::allocator<Candidate>_>::~vector
                ((vector<Candidate,_std::allocator<Candidate>_> *)&fix.filename_distance);
      IncludeStmt::~IncludeStmt
                ((IncludeStmt *)
                 &candidate_fixes.super__Vector_base<Candidate,_std::allocator<Candidate>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&endPathPos);
      std::__cxx11::string::~string((string *)(path_with_quotes.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(behind_path.field_2._M_local_buf + 8));
    }
    else {
      poVar3 = std::operator<<(local_1d0,(string *)(prefix_all.field_2._M_local_buf + 8));
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::string::~string((string *)local_498);
    std::__cxx11::string::~string((string *)local_470);
    std::__cxx11::string::~string(local_448);
  } while( true );
}

Assistant:

void process_file(fs::path file, const std::vector<IncludePath> &include_paths,
                  const std::map<IncludePath, std::vector<fs::path>> &headers,
                  ProcessResult *result) {
  std::cout << "    Process " << file.string() << " ..." << std::endl;
  std::stringstream buffer;
  std::ifstream in(file.string());
  std::string line;
  while (std::getline(in, line, '\n')) {
    std::string prefix_all = "#include ";
    std::string prefix_system = "#include <";
    std::string prefix_user = "#include \"";
    if (boost::starts_with(line, prefix_user) ||
        (boost::starts_with(line, prefix_system) && process_system_includes)) {
      (result->total)++;

      std::string path, behind_path, path_with_quotes;
      size_t endPathPos = 0;
      bool system = false;
      if (boost::starts_with(line, prefix_user)) {
        endPathPos = line.find("\"", prefix_user.size());
        system = false;
      } else if (boost::starts_with(line, prefix_system)) {
        endPathPos = line.find(">", prefix_system.size());
        system = true;
      }

      path = line.substr(prefix_user.size(), endPathPos - prefix_user.size());
      path_with_quotes =
          line.substr(prefix_all.size(), endPathPos - prefix_all.size() + 1);
      behind_path = line.substr(endPathPos + 1);

      IncludeStmt current{path, system};
      std::vector<Candidate> candidate_fixes = fix_include(
          current, file, include_paths, headers, prefer_relative_to_root);

      if (!candidate_fixes.empty()) {
        Candidate fix = candidate_fixes[0];
        std::string fixed_path_with_quotes;
        bool emit_system_include = false;
        if ((system && fix.search_path.system) || // already good
            (!system && fix.search_path.system &&
             user_to_system) || // changed to system
            (system && !fix.search_path.system &&
             !user_to_system)) { // can't touch
          emit_system_include = true;
        }

        if (emit_system_include) {
          fixed_path_with_quotes = "<" + fix.header + ">";
        } else {
          fixed_path_with_quotes = "\"" + fix.header + "\"";
        }

        bool changed_include_type = system != emit_system_include;
        if (changed_include_type) {
          if (system) {
            result->system_to_user++;
          } else {
            result->user_to_system++;
          }
        }

        buffer << "#include " << fixed_path_with_quotes << behind_path
               << std::endl;
        if (fix.header != path) {
          (result->replaced_path)++;

          std::cout << YELLOW
                    << "        👕 Replace include path: " << path_with_quotes;
          std::cout << "  ->  " << fixed_path_with_quotes;
          std::cout << DIM << "  (distance: fn=" << fix.filename_distance
                    << "; dir=" << fix.folder_distance << ") from "
                    << fix.search_path.path << CLEAR << std::endl;
        } else if (changed_include_type) {
          std::cout << BLUE
                    << "        💄 Change include type: " << path_with_quotes;
          std::cout << "  ->  " << fixed_path_with_quotes << CLEAR << std::endl;
        } else {
          (result->untouched)++;

          if (omit_untouched) {
            continue; // the line is written.
          }
          std::cout << GREEN
                    << "        ✅ Untouched include: " << path_with_quotes
                    << CLEAR << std::endl;
        }

        for (int alt_idx = 1; alt_idx < candidate_fixes.size(); ++alt_idx) {
          Candidate &alt = candidate_fixes[alt_idx];
          std::cout << DIM << "           - Alternative: " << alt.header;
          std::cout << DIM << "  (distance: fn=" << alt.filename_distance
                    << "; dir=" << alt.folder_distance << ") from "
                    << alt.search_path.path << CLEAR << std::endl;
        }

      } else {
        buffer << line << std::endl;
        (result->failed)++;

        if (omit_system_failed && system) {
          continue; // the line is written.
        }
        std::cout << RED
                  << "        ❓ Failed to fix include: " << path_with_quotes
                  << CLEAR << std::endl;
      }
    } else {
      buffer << line << std::endl;
    }
  }
  in.close();

  if (!dry_run) {
    std::ofstream out(file.string());
    out << buffer.str();
    out.close();
  }
}